

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFGdbIndex.cpp
# Opt level: O0

void __thiscall llvm::DWARFGdbIndex::dumpSymbolTable(DWARFGdbIndex *this,raw_ostream *OS)

{
  pair<unsigned_int,_llvm::SmallVector<unsigned_int,_0U>_> *ppVar1;
  raw_ostream *prVar2;
  const_iterator pSVar3;
  const_iterator ppVar4;
  const_iterator __last;
  pair<unsigned_int,_llvm::SmallVector<unsigned_int,_0U>_> *ppVar5;
  unsigned_long *in_R8;
  uint32_t *Vals_1;
  uint *in_R9;
  char *local_d8;
  format_object<const_char_*,_unsigned_int> local_d0;
  undefined4 local_ac;
  const_iterator pSStack_a8;
  uint32_t CuVectorId;
  pair<unsigned_int,_llvm::SmallVector<unsigned_int,_0U>_> *local_a0;
  pair<unsigned_int,_llvm::SmallVector<unsigned_int,_0U>_> *CuVector;
  StringRef Name;
  SymTableEntry *E;
  const_iterator __end1;
  const_iterator __begin1;
  SmallVector<llvm::DWARFGdbIndex::SymTableEntry,_0U> *__range1;
  size_t sStack_40;
  uint32_t I;
  format_object<unsigned_int,_unsigned_long> local_38;
  raw_ostream *local_18;
  raw_ostream *OS_local;
  DWARFGdbIndex *this_local;
  
  local_18 = OS;
  OS_local = (raw_ostream *)this;
  sStack_40 = SmallVectorBase::size((SmallVectorBase *)&this->SymbolTable);
  format<unsigned_int,unsigned_long>
            (&local_38,(llvm *)"\n  Symbol table offset = 0x%x, size = %ld, filled slots:",
             (char *)&this->SymbolTableOffset,(uint *)&stack0xffffffffffffffc0,in_R8);
  prVar2 = raw_ostream::operator<<(OS,&local_38.super_format_object_base);
  raw_ostream::operator<<(prVar2,'\n');
  __range1._4_4_ = -1;
  __end1 = SmallVectorTemplateCommon<llvm::DWARFGdbIndex::SymTableEntry,_void>::begin
                     ((SmallVectorTemplateCommon<llvm::DWARFGdbIndex::SymTableEntry,_void> *)
                      &this->SymbolTable);
  pSVar3 = SmallVectorTemplateCommon<llvm::DWARFGdbIndex::SymTableEntry,_void>::end
                     ((SmallVectorTemplateCommon<llvm::DWARFGdbIndex::SymTableEntry,_void> *)
                      &this->SymbolTable);
  do {
    prVar2 = local_18;
    if (__end1 == pSVar3) {
      return;
    }
    __range1._4_4_ = __range1._4_4_ + 1;
    if ((__end1->NameOffset != 0) || (__end1->VecOffset != 0)) {
      Vals_1 = &__end1->VecOffset;
      format<unsigned_int,unsigned_int,unsigned_int>
                ((format_object<unsigned_int,_unsigned_int,_unsigned_int> *)&Name.Length,
                 (llvm *)"    %d: Name offset = 0x%x, CU vector offset = 0x%x\n",
                 (char *)((long)&__range1 + 4),&__end1->NameOffset,Vals_1,in_R9);
      raw_ostream::operator<<(prVar2,(format_object_base *)&Name.Length);
      _CuVector = StringRef::substr(&this->ConstantPoolStrings,
                                    (ulong)((this->ConstantPoolOffset - this->StringPoolOffset) +
                                           __end1->NameOffset),0xffffffffffffffff);
      ppVar4 = SmallVectorTemplateCommon<std::pair<unsigned_int,_llvm::SmallVector<unsigned_int,_0U>_>,_void>
               ::begin((SmallVectorTemplateCommon<std::pair<unsigned_int,_llvm::SmallVector<unsigned_int,_0U>_>,_void>
                        *)&this->ConstantPoolVectors);
      __last = SmallVectorTemplateCommon<std::pair<unsigned_int,_llvm::SmallVector<unsigned_int,_0U>_>,_void>
               ::end((SmallVectorTemplateCommon<std::pair<unsigned_int,_llvm::SmallVector<unsigned_int,_0U>_>,_void>
                      *)&this->ConstantPoolVectors);
      pSStack_a8 = __end1;
      ppVar5 = std::
               find_if<std::pair<unsigned_int,llvm::SmallVector<unsigned_int,0u>>const*,llvm::DWARFGdbIndex::dumpSymbolTable(llvm::raw_ostream&)const::__0>
                         (ppVar4,__last,(anon_class_8_1_54a397e5_for__M_pred)__end1);
      local_a0 = ppVar5;
      ppVar4 = SmallVectorTemplateCommon<std::pair<unsigned_int,_llvm::SmallVector<unsigned_int,_0U>_>,_void>
               ::end((SmallVectorTemplateCommon<std::pair<unsigned_int,_llvm::SmallVector<unsigned_int,_0U>_>,_void>
                      *)&this->ConstantPoolVectors);
      ppVar1 = local_a0;
      if (ppVar5 == ppVar4) {
        __assert_fail("CuVector != ConstantPoolVectors.end() && \"Invalid symbol table\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/DWARFGdbIndex.cpp"
                      ,0x4f,"void llvm::DWARFGdbIndex::dumpSymbolTable(raw_ostream &) const");
      }
      ppVar4 = SmallVectorTemplateCommon<std::pair<unsigned_int,_llvm::SmallVector<unsigned_int,_0U>_>,_void>
               ::begin((SmallVectorTemplateCommon<std::pair<unsigned_int,_llvm::SmallVector<unsigned_int,_0U>_>,_void>
                        *)&this->ConstantPoolVectors);
      prVar2 = local_18;
      local_ac = (undefined4)(((long)ppVar1 - (long)ppVar4) / 0x18);
      local_d8 = StringRef::data((StringRef *)&CuVector);
      format<char_const*,unsigned_int>
                (&local_d0,(llvm *)"      String name: %s, CU vector index: %d\n",(char *)&local_d8,
                 (char **)&local_ac,Vals_1);
      raw_ostream::operator<<(prVar2,&local_d0.super_format_object_base);
    }
    __end1 = __end1 + 1;
  } while( true );
}

Assistant:

void DWARFGdbIndex::dumpSymbolTable(raw_ostream &OS) const {
  OS << format("\n  Symbol table offset = 0x%x, size = %" PRId64
               ", filled slots:",
               SymbolTableOffset, (uint64_t)SymbolTable.size())
     << '\n';
  uint32_t I = -1;
  for (const SymTableEntry &E : SymbolTable) {
    ++I;
    if (!E.NameOffset && !E.VecOffset)
      continue;

    OS << format("    %d: Name offset = 0x%x, CU vector offset = 0x%x\n", I,
                 E.NameOffset, E.VecOffset);

    StringRef Name = ConstantPoolStrings.substr(
        ConstantPoolOffset - StringPoolOffset + E.NameOffset);

    auto CuVector = std::find_if(
        ConstantPoolVectors.begin(), ConstantPoolVectors.end(),
        [&](const std::pair<uint32_t, SmallVector<uint32_t, 0>> &V) {
          return V.first == E.VecOffset;
        });
    assert(CuVector != ConstantPoolVectors.end() && "Invalid symbol table");
    uint32_t CuVectorId = CuVector - ConstantPoolVectors.begin();
    OS << format("      String name: %s, CU vector index: %d\n", Name.data(),
                 CuVectorId);
  }
}